

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O0

void __thiscall
miniros::ServiceClient::ServiceClient
          (ServiceClient *this,string *service_name,bool persistent,M_string *header_values,
          string *service_md5sum)

{
  uint uVar1;
  element_type *peVar2;
  byte in_DL;
  string *in_RSI;
  string *in_R8;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  bool in_stack_000000cf;
  string *in_stack_000000d0;
  ServiceManager *in_stack_000000d8;
  M_string *in_stack_000000f0;
  Impl *in_stack_ffffffffffffff48;
  M_string *__r;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  operator_new(0x90);
  Impl::Impl((Impl *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::shared_ptr<miniros::ServiceClient::Impl>::shared_ptr<miniros::ServiceClient::Impl,void>
            ((shared_ptr<miniros::ServiceClient::Impl> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  peVar2 = std::
           __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a3866);
  std::__cxx11::string::operator=((string *)&peVar2->name_,in_RSI);
  peVar2 = std::
           __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a388e);
  peVar2->persistent_ = (bool)(in_DL & 1);
  std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4a38af);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_ffffffffffffff48);
  peVar2 = std::
           __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4a38d9);
  std::__cxx11::string::operator=((string *)&peVar2->service_md5sum_,in_R8);
  if ((bool)(in_DL & 1) != false) {
    ServiceManager::instance();
    std::__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4a3910);
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a391f);
    peVar2 = std::
             __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a3932);
    uVar1 = (uint)peVar2->persistent_;
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3944);
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a3957);
    peVar2 = std::
             __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a396a);
    __r = &peVar2->header_values_;
    ServiceManager::createServiceServerLink
              (in_stack_000000d8,in_stack_000000d0,in_stack_000000cf,in_stack_000000c0,
               in_stack_000000b8,in_stack_000000f0);
    std::__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a39a8);
    std::shared_ptr<miniros::ServiceServerLink>::operator=
              ((shared_ptr<miniros::ServiceServerLink> *)CONCAT44(uVar1,in_stack_ffffffffffffff50),
               (shared_ptr<miniros::ServiceServerLink> *)__r);
    std::shared_ptr<miniros::ServiceServerLink>::~shared_ptr
              ((shared_ptr<miniros::ServiceServerLink> *)0x4a39bf);
  }
  return;
}

Assistant:

ServiceClient::ServiceClient(const std::string& service_name, bool persistent, const M_string& header_values, const std::string& service_md5sum)
: impl_(new Impl)
{
  impl_->name_ = service_name;
  impl_->persistent_ = persistent;
  impl_->header_values_ = header_values;
  impl_->service_md5sum_ = service_md5sum;

  if (persistent)
  {
    impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, impl_->service_md5sum_, impl_->service_md5sum_, impl_->header_values_);
  }
}